

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O2

size_t hpa_try_alloc_batch_no_grow
                 (tsdn_t *tsdn,hpa_shard_t *shard,size_t size,_Bool *oom,size_t nallocs,
                 edata_list_active_t *results,_Bool *deferred_work_generated)

{
  edata_cache_fast_t *ecs;
  psset_t *psset;
  uint uVar1;
  _func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr *p_Var2;
  _Bool _Var3;
  edata_t *edata;
  hpa_shard_t *phVar4;
  void *pvVar5;
  hpdata_t *ps;
  size_t sVar6;
  
  malloc_mutex_lock(tsdn,&shard->mtx);
  ecs = &shard->ecf;
  psset = &shard->psset;
  sVar6 = 0;
  do {
    if (nallocs == sVar6) {
LAB_00e6c616:
      phVar4 = shard;
      hpa_shard_maybe_do_deferred_work(tsdn,shard,false);
      _Var3 = hpa_shard_has_deferred_work((tsdn_t *)shard,phVar4);
      *deferred_work_generated = _Var3;
      (shard->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48));
      return nallocs;
    }
    edata = duckdb_je_edata_cache_fast_get(tsdn,ecs);
    if (edata == (edata_t *)0x0) {
LAB_00e6c60e:
      *oom = true;
      nallocs = sVar6;
      goto LAB_00e6c616;
    }
    phVar4 = (hpa_shard_t *)duckdb_je_psset_pick_alloc(psset,size);
    if (phVar4 == (hpa_shard_t *)0x0) {
      duckdb_je_edata_cache_fast_put(tsdn,ecs,edata);
      nallocs = sVar6;
      goto LAB_00e6c616;
    }
    duckdb_je_psset_update_begin(psset,(hpdata_t *)phVar4);
    if ((phVar4->mtx).field_0.witness.link.qre_prev == (witness_t *)0x0) {
      p_Var2 = (_func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr
                *)shard->age_counter;
      shard->age_counter = (uint64_t)(p_Var2 + 1);
      (phVar4->pai).alloc_batch = p_Var2;
    }
    pvVar5 = duckdb_je_hpdata_reserve_alloc((hpdata_t *)phVar4,size);
    uVar1 = shard->ind;
    p_Var2 = (phVar4->pai).alloc_batch;
    edata->e_addr = pvVar5;
    (edata->field_2).e_size_esn = (uint)(edata->field_2).e_size_esn & 0xfff | size;
    edata->e_sn = (uint64_t)p_Var2;
    edata->e_bits = (ulong)(uVar1 & 0xf0000fff) | edata->e_bits & 0xffffeffff0000000 | 0xe806000;
    edata->e_ps = (hpdata_t *)phVar4;
    _Var3 = duckdb_je_emap_register_boundary(tsdn,shard->emap,edata,0xe8,false);
    if (_Var3) {
      duckdb_je_hpdata_unreserve
                ((hpdata_t *)phVar4,edata->e_addr,(edata->field_2).e_size_esn & 0xfffffffffffff000);
      duckdb_je_psset_update_end(psset,(hpdata_t *)phVar4);
      duckdb_je_edata_cache_fast_put(tsdn,ecs,edata);
      goto LAB_00e6c60e;
    }
    hpa_update_purge_hugify_eligibility((tsdn_t *)shard,phVar4,ps);
    duckdb_je_psset_update_end(psset,(hpdata_t *)phVar4);
    edata_list_active_append(results,edata);
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

static size_t
hpa_try_alloc_batch_no_grow(tsdn_t *tsdn, hpa_shard_t *shard, size_t size,
    bool *oom, size_t nallocs, edata_list_active_t *results,
    bool *deferred_work_generated) {
	malloc_mutex_lock(tsdn, &shard->mtx);
	size_t nsuccess = 0;
	for (; nsuccess < nallocs; nsuccess++) {
		edata_t *edata = hpa_try_alloc_one_no_grow(tsdn, shard, size,
		    oom);
		if (edata == NULL) {
			break;
		}
		edata_list_active_append(results, edata);
	}

	hpa_shard_maybe_do_deferred_work(tsdn, shard, /* forced */ false);
	*deferred_work_generated = hpa_shard_has_deferred_work(tsdn, shard);
	malloc_mutex_unlock(tsdn, &shard->mtx);
	return nsuccess;
}